

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

TIFFReadDirEntryErr TIFFReadDirEntryDoubleArray(TIFF *tif,TIFFDirEntry *direntry,double **value)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  TIFFReadDirEntryErr TVar7;
  double *pdVar8;
  long lVar9;
  ulong n;
  int64_t *ma;
  double *lp;
  uint32_t *puVar10;
  double dVar11;
  uint32_t count;
  void *origdata;
  uint local_3c;
  double *local_38;
  
  TVar7 = TIFFReadDirEntryErrType;
  if ((direntry->tdir_type < 0x12) &&
     (TVar7 = TIFFReadDirEntryErrType, (0x31f7aU >> (direntry->tdir_type & 0x1f) & 1) != 0)) {
    TVar7 = TIFFReadDirEntryArrayWithLimit(tif,direntry,&local_3c,8,&local_38,0xffffffffffffffff);
    lp = local_38;
    uVar3 = local_3c;
    if (local_38 == (double *)0x0 || TVar7 != TIFFReadDirEntryErrOk) {
      *value = (double *)0x0;
    }
    else {
      if (direntry->tdir_type == 0xc) {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabArrayOfLong8((uint64_t *)local_38,(ulong)local_3c);
        }
        *value = local_38;
      }
      else {
        n = (ulong)local_3c;
        pdVar8 = (double *)_TIFFmallocExt(tif,n * 8);
        if (pdVar8 == (double *)0x0) {
          _TIFFfreeExt(tif,lp);
          return TIFFReadDirEntryErrAlloc;
        }
        switch(direntry->tdir_type) {
        case 1:
          if (n != 0) {
            lVar9 = 0;
            do {
              pdVar8[lVar9] = (double)*(byte *)((long)lp + lVar9);
              lVar9 = lVar9 + 1;
            } while (uVar3 != (uint)lVar9);
          }
          break;
        case 3:
          if (n != 0) {
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabShort((uint16_t *)lp);
              }
              uVar2 = *(ushort *)lp;
              lp = (double *)((long)lp + 2);
              pdVar8[lVar9] = (double)uVar2;
              lVar9 = lVar9 + 1;
            } while (uVar3 != (uint)lVar9);
          }
          break;
        case 4:
          if (n != 0) {
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)lp);
              }
              uVar4 = *(uint *)lp;
              lp = (double *)((long)lp + 4);
              pdVar8[lVar9] = (double)uVar4;
              lVar9 = lVar9 + 1;
            } while (uVar3 != (uint)lVar9);
          }
          break;
        case 5:
          if (local_3c != 0) {
            puVar10 = (uint32_t *)((long)lp + 4);
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong(puVar10 + -1);
              }
              uVar3 = puVar10[-1];
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong(puVar10);
              }
              dVar11 = 0.0;
              if (*puVar10 != 0) {
                dVar11 = (double)uVar3 / (double)*puVar10;
              }
              pdVar8[lVar9] = dVar11;
              lVar9 = lVar9 + 1;
              puVar10 = puVar10 + 2;
            } while ((uint)lVar9 < local_3c);
          }
          break;
        case 6:
          if (n != 0) {
            lVar9 = 0;
            do {
              pdVar8[lVar9] = (double)(int)*(char *)((long)lp + lVar9);
              lVar9 = lVar9 + 1;
            } while (uVar3 != (uint)lVar9);
          }
          break;
        case 8:
          if (n != 0) {
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabShort((uint16_t *)lp);
              }
              sVar1 = *(short *)lp;
              lp = (double *)((long)lp + 2);
              pdVar8[lVar9] = (double)(int)sVar1;
              lVar9 = lVar9 + 1;
            } while (uVar3 != (uint)lVar9);
          }
          break;
        case 9:
          if (n != 0) {
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)lp);
              }
              iVar5 = *(int *)lp;
              lp = (double *)((long)lp + 4);
              pdVar8[lVar9] = (double)iVar5;
              lVar9 = lVar9 + 1;
            } while (uVar3 != (uint)lVar9);
          }
          break;
        case 10:
          if (local_3c != 0) {
            puVar10 = (uint32_t *)((long)lp + 4);
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong(puVar10 + -1);
              }
              uVar6 = puVar10[-1];
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong(puVar10);
              }
              dVar11 = 0.0;
              if (*puVar10 != 0) {
                dVar11 = (double)(int)uVar6 / (double)*puVar10;
              }
              pdVar8[lVar9] = dVar11;
              lVar9 = lVar9 + 1;
              puVar10 = puVar10 + 2;
            } while ((uint)lVar9 < local_3c);
          }
          break;
        case 0xb:
          if ((tif->tif_flags & 0x80) != 0) {
            TIFFSwabArrayOfLong((uint32_t *)lp,n);
          }
          if (n != 0) {
            lVar9 = 0;
            do {
              pdVar8[lVar9] = (double)*(float *)((long)lp + lVar9 * 4);
              lVar9 = lVar9 + 1;
            } while (uVar3 != (uint)lVar9);
          }
          break;
        case 0x10:
          if (n != 0) {
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong8((uint64_t *)lp);
              }
              dVar11 = *lp;
              lp = lp + 1;
              pdVar8[lVar9] =
                   ((double)CONCAT44(0x45300000,(int)((ulong)dVar11 >> 0x20)) -
                   1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,SUB84(dVar11,0)) - 4503599627370496.0);
              lVar9 = lVar9 + 1;
            } while (uVar3 != (uint)lVar9);
          }
          break;
        case 0x11:
          if (n != 0) {
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong8((uint64_t *)lp);
              }
              dVar11 = *lp;
              lp = lp + 1;
              pdVar8[lVar9] = (double)(long)dVar11;
              lVar9 = lVar9 + 1;
            } while (uVar3 != (uint)lVar9);
          }
        }
        _TIFFfreeExt(tif,local_38);
        *value = pdVar8;
      }
      TVar7 = TIFFReadDirEntryErrOk;
    }
  }
  return TVar7;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryDoubleArray(TIFF *tif, TIFFDirEntry *direntry, double **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    double *data;
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        case TIFF_SBYTE:
        case TIFF_SHORT:
        case TIFF_SSHORT:
        case TIFF_LONG:
        case TIFF_SLONG:
        case TIFF_LONG8:
        case TIFF_SLONG8:
        case TIFF_RATIONAL:
        case TIFF_SRATIONAL:
        case TIFF_FLOAT:
        case TIFF_DOUBLE:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 8, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_DOUBLE:
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong8((uint64_t *)origdata, count);
            TIFFCvtIEEEDoubleToNative(tif, count, (double *)origdata);
            *value = (double *)origdata;
            return (TIFFReadDirEntryErrOk);
    }
    data = (double *)_TIFFmallocExt(tif, count * sizeof(double));
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
        case TIFF_SBYTE:
        {
            int8_t *ma;
            double *mb;
            uint32_t n;
            ma = (int8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
        case TIFF_SHORT:
        {
            uint16_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint16_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_SSHORT:
        {
            int16_t *ma;
            double *mb;
            uint32_t n;
            ma = (int16_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort((uint16_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_LONG:
        {
            uint32_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_SLONG:
        {
            int32_t *ma;
            double *mb;
            uint32_t n;
            ma = (int32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong((uint32_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_LONG8:
        {
            uint64_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(ma);
#if defined(__WIN32__) && (_MSC_VER < 1500)
                /*
                 * XXX: MSVC 6.0 does not support
                 * conversion of 64-bit integers into
                 * floating point values.
                 */
                *mb++ = _TIFFUInt64ToDouble(*ma++);
#else
                *mb++ = (double)(*ma++);
#endif
            }
        }
        break;
        case TIFF_SLONG8:
        {
            int64_t *ma;
            double *mb;
            uint32_t n;
            ma = (int64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8((uint64_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_RATIONAL:
        {
            uint32_t *ma;
            uint32_t maa;
            uint32_t mab;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                maa = *ma++;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                mab = *ma++;
                if (mab == 0)
                    *mb++ = 0.0;
                else
                    *mb++ = (double)maa / (double)mab;
            }
        }
        break;
        case TIFF_SRATIONAL:
        {
            uint32_t *ma;
            int32_t maa;
            uint32_t mab;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                maa = *(int32_t *)ma;
                ma++;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                mab = *ma++;
                if (mab == 0)
                    *mb++ = 0.0;
                else
                    *mb++ = (double)maa / (double)mab;
            }
        }
        break;
        case TIFF_FLOAT:
        {
            float *ma;
            double *mb;
            uint32_t n;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong((uint32_t *)origdata, count);
            TIFFCvtIEEEFloatToNative(tif, count, (float *)origdata);
            ma = (float *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    *value = data;
    return (TIFFReadDirEntryErrOk);
}